

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMarshall.c
# Opt level: O0

JL_STATUS JlMarshallFromStructToNewDataObject
                    (void *Structure,JlMarshallElement *StructDescription,
                    size_t StructDescriptionCount,JlDataObject **pDictionaryObject)

{
  JlDataObject *local_38;
  JlDataObject *newDictionaryObject;
  JlDataObject **ppJStack_28;
  JL_STATUS jlStatus;
  JlDataObject **pDictionaryObject_local;
  size_t StructDescriptionCount_local;
  JlMarshallElement *StructDescription_local;
  void *Structure_local;
  
  if ((((Structure == (void *)0x0) || (StructDescription == (JlMarshallElement *)0x0)) ||
      (StructDescriptionCount == 0)) || (pDictionaryObject == (JlDataObject **)0x0)) {
    newDictionaryObject._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    local_38 = (JlDataObject *)0x0;
    *pDictionaryObject = (JlDataObject *)0x0;
    ppJStack_28 = pDictionaryObject;
    pDictionaryObject_local = (JlDataObject **)StructDescriptionCount;
    StructDescriptionCount_local = (size_t)StructDescription;
    StructDescription_local = (JlMarshallElement *)Structure;
    newDictionaryObject._4_4_ = JlCreateObject(JL_DATA_TYPE_DICTIONARY,&local_38);
    if (newDictionaryObject._4_4_ == JL_STATUS_SUCCESS) {
      newDictionaryObject._4_4_ =
           JlMarshallFromStructToDataObject
                     (StructDescription_local,(JlMarshallElement *)StructDescriptionCount_local,
                      (size_t)pDictionaryObject_local,local_38);
      if (newDictionaryObject._4_4_ == JL_STATUS_SUCCESS) {
        *ppJStack_28 = local_38;
      }
      else {
        JlFreeObjectTree(&local_38);
      }
    }
  }
  return newDictionaryObject._4_4_;
}

Assistant:

JL_STATUS
    JlMarshallFromStructToNewDataObject
    (
        void const*                 Structure,
        JlMarshallElement const*    StructDescription,
        size_t                      StructDescriptionCount,
        JlDataObject**              pDictionaryObject
    )
{
    JL_STATUS jlStatus;

    if(     NULL != Structure
        &&  NULL != StructDescription
        &&  0 != StructDescriptionCount
        &&  NULL != pDictionaryObject )
    {
        JlDataObject* newDictionaryObject = NULL;
        *pDictionaryObject = NULL;

        jlStatus = JlCreateObject( JL_DATA_TYPE_DICTIONARY, &newDictionaryObject );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = JlMarshallFromStructToDataObject( Structure, StructDescription, StructDescriptionCount, newDictionaryObject );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                *pDictionaryObject = newDictionaryObject;
            }
            else
            {
                JlFreeObjectTree( &newDictionaryObject );
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}